

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O2

void n_structure_suite::n_structure_unicode_identifier(void)

{
  char input [3];
  reader reader;
  char local_170 [4];
  undefined4 local_16c;
  view_type local_168;
  basic_reader<char> local_158;
  
  local_170[2] = 0;
  local_170[0] = -0x3d;
  local_170[1] = -0x5b;
  local_168._M_len = strlen(local_170);
  local_168._M_str = local_170;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_168);
  local_168._M_len = CONCAT44(local_168._M_len._4_4_,local_158.decoder.current.code);
  local_16c = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xa3a,"void n_structure_suite::n_structure_unicode_identifier()",&local_168,&local_16c
            );
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_158.stack);
  return;
}

Assistant:

void n_structure_unicode_identifier()
{
    const char input[] = "\xC3\xA5";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unexpected_token);
}